

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O1

Stream * rw::d3d9::writeNativeData
                   (Stream *stream,int32 len,void *object,int32 param_4,int32 param_5)

{
  short *psVar1;
  long lVar2;
  void *vertexBuffer;
  int32 iVar3;
  undefined4 uVar4;
  undefined4 *puVar5;
  uint16 *puVar6;
  uint8 *puVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  undefined4 *puVar11;
  undefined4 *puVar12;
  uint32 val;
  VertexElement elements [12];
  undefined1 local_98 [104];
  
  writeChunkHeader(stream,1,len + -0xc);
  if ((*(int **)((long)object + 0x98) != (int *)0x0) && (**(int **)((long)object + 0x98) == 9)) {
    Stream::writeU32(stream,9);
    lVar2 = *(long *)((long)object + 0x98);
    lVar10 = (ulong)*(ushort *)(*(long *)((long)object + 0x90) + 4) * 0x24 + 0x40;
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d9.cpp line: 254"
    ;
    puVar5 = (undefined4 *)(*DAT_00149da8)(lVar10,0x1000f);
    Stream::writeI32(stream,(int32)lVar10);
    *puVar5 = *(undefined4 *)(lVar2 + 4);
    puVar5[1] = *(undefined4 *)(lVar2 + 8);
    puVar5[3] = *(undefined4 *)(lVar2 + 0x18);
    puVar5[0xc] = *(undefined4 *)(lVar2 + 0x50);
    puVar5[0xe] = *(undefined4 *)(lVar2 + 0x60);
    puVar5[0xf] = *(undefined4 *)(lVar2 + 100);
    if (*(int *)(lVar2 + 8) != 0) {
      puVar11 = *(undefined4 **)(lVar2 + 0x68);
      puVar12 = puVar5 + 0x10;
      uVar8 = 0;
      do {
        *puVar12 = *puVar11;
        puVar12[1] = puVar11[1];
        iVar3 = MaterialList::findIndex
                          ((MaterialList *)((long)object + 0x80),*(Material **)(puVar11 + 2));
        puVar12[2] = iVar3;
        puVar12[3] = puVar11[4];
        puVar12[4] = 0;
        puVar12[5] = puVar11[8];
        puVar12[6] = puVar11[9];
        puVar12[7] = puVar11[10];
        puVar12[8] = puVar11[0xb];
        puVar12 = puVar12 + 9;
        puVar11 = puVar11 + 0xc;
        uVar8 = uVar8 + 1;
      } while (uVar8 < *(uint *)(lVar2 + 8));
    }
    (*stream->_vptr_Stream[3])(stream,puVar5,lVar10);
    val = 0;
    uVar9 = 0;
    do {
      val = val + 1;
      psVar1 = (short *)((long)*(void **)(lVar2 + 0x58) + uVar9);
      uVar9 = uVar9 + 8;
    } while (*psVar1 != 0xff);
    memcpy(local_98,*(void **)(lVar2 + 0x58),uVar9 & 0x7fffffff8);
    Stream::writeU32(stream,val);
    (*stream->_vptr_Stream[3])(stream,local_98,uVar9 & 0xffffffff);
    puVar6 = d3d::lockIndices(*(void **)(lVar2 + 0x10),0,0,0);
    (*stream->_vptr_Stream[3])(stream,puVar6,(ulong)(uint)(*(int *)(lVar2 + 0x60) * 2));
    d3d::unlockIndices(*(void **)(lVar2 + 0x10));
    lVar10 = 0;
    do {
      uVar4 = 0xbadeaffe;
      if (*(long *)(lVar2 + 0x20 + lVar10) == 0) {
        uVar4 = 0;
      }
      *puVar5 = uVar4;
      puVar5[1] = *(undefined4 *)(lVar2 + 0x28 + lVar10);
      puVar5[2] = *(undefined4 *)(lVar2 + 0x2c + lVar10);
      *(undefined2 *)(puVar5 + 3) = *(undefined2 *)(lVar2 + 0x30 + lVar10);
      *(undefined1 *)((long)puVar5 + 0xe) = *(undefined1 *)(lVar2 + 0x32 + lVar10);
      *(undefined1 *)((long)puVar5 + 0xf) = *(undefined1 *)(lVar2 + 0x33 + lVar10);
      (*stream->_vptr_Stream[3])(stream,puVar5,0x10);
      vertexBuffer = *(void **)(lVar2 + 0x20 + lVar10);
      if (vertexBuffer != (void *)0x0) {
        puVar7 = d3d::lockVertices(vertexBuffer,0,0,0);
        (*stream->_vptr_Stream[3])
                  (stream,puVar7,
                   (ulong)(uint)(*(int *)(lVar2 + 100) * *(int *)(lVar2 + 0x2c + lVar10)));
        d3d::unlockVertices(*(void **)(lVar2 + 0x20 + lVar10));
      }
      lVar10 = lVar10 + 0x18;
    } while (lVar10 == 0x18);
    (*DAT_00149da0)(puVar5);
  }
  return stream;
}

Assistant:

Stream*
writeNativeData(Stream *stream, int32 len, void *object, int32, int32)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	writeChunkHeader(stream, ID_STRUCT, len-12);
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_D3D9)
		return stream;
	stream->writeU32(PLATFORM_D3D9);
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	int32 size = 64 + geometry->meshHeader->numMeshes*36;
	uint8 *data = rwNewT(uint8, size, MEMDUR_FUNCTION | ID_GEOMETRY);
	stream->writeI32(size);

	uint8 *p = data;
	*(uint32*)p = header->serialNumber; p += 4;
	*(uint32*)p = header->numMeshes; p += 4;
	p += 4;		// skip index buffer
	*(uint32*)p = header->primType; p += 4;
	p += 16*2;	// skip vertex streams, they're repeated with the vertex buffers
	*(bool32*)p = header->useOffsets; p += 4;
	p += 4;		// skip vertex declaration
	*(uint32*)p = header->totalNumIndex; p += 4;
	*(uint32*)p = header->totalNumVertex; p += 4;

	InstanceData *inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		*(uint32*)p = inst->numIndex; p += 4;
		*(uint32*)p = inst->minVert; p += 4;
		int32 matid = geometry->matList.findIndex(inst->material);
		*(int32*)p = matid; p += 4;
		*(bool32*)p = inst->vertexAlpha; p += 4;
		*(uint32*)p = 0; p += 4;		// vertex shader
		*(uint32*)p = inst->baseIndex; p += 4;	// not used but meh...
		*(uint32*)p = inst->numVertices; p += 4;
		*(uint32*)p = inst->startIndex; p += 4;
		*(uint32*)p = inst->numPrimitives; p += 4;
		inst++;
	}
	stream->write8(data, size);

	VertexElement elements[NUMDECLELT];
	uint32 numElt = getDeclaration(header->vertexDeclaration, elements);
	stream->writeU32(numElt);
	stream->write8(elements, 8*numElt);

	uint16 *indices = lockIndices(header->indexBuffer, 0, 0, 0);
	stream->write8(indices, 2*header->totalNumIndex);
	unlockIndices(header->indexBuffer);

	VertexStream *s;
	for(int i = 0; i < 2; i++){
		s = &header->vertexStream[i];
		p = data;
		*(uint32*)p = s->vertexBuffer ? 0xbadeaffe : 0; p += 4;
		*(uint32*)p = s->offset; p += 4;
		*(uint32*)p = s->stride; p += 4;
		*(uint16*)p = s->geometryFlags; p += 2;
		*p++ = s->managed;
		*p++ = s->dynamicLock;
		stream->write8(data, 16);

		if(s->vertexBuffer == nil)
			continue;
		uint8 *verts = lockVertices(s->vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
		stream->write8(verts, s->stride*header->totalNumVertex);
		unlockVertices(s->vertexBuffer);
	}

	rwFree(data);
	return stream;
}